

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOAidFunction.cpp
# Opt level: O2

double getCost0(int i)

{
  char *pcVar1;
  char *c7;
  basic_istream<char,_std::char_traits<char>_> *__in;
  size_t sVar2;
  double dVar3;
  ifstream infile;
  char strAns [10000];
  char buffer [10000];
  ifstream local_5040 [520];
  char local_4e38;
  char local_4e37;
  char local_2728 [10000];
  
  pcVar1 = catStrIntStr(energyFileAddress,"tempFile/temp_",i,".pdb");
  c7 = catStrIntStr(energyFileAddress,"/defaultFile/default",i,".sc");
  pcVar1 = catStrStr(scoreAddress," -database ",databaseAddress," -s ",pcVar1,
                     " -out:file:scorefile ",c7);
  system(pcVar1);
  std::ifstream::ifstream(local_5040);
  openFile(c7,local_5040);
  std::istream::getline((char *)local_5040,(long)local_2728);
  __in = std::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_5040,local_2728);
  std::operator>>(__in,&local_4e38);
  if (local_4e38 != 'n') {
    sVar2 = strlen(&local_4e38);
    if (((int)sVar2 < 2) || (local_4e37 != 'n')) {
      dVar3 = atof(&local_4e38);
      goto LAB_0010422f;
    }
  }
  dVar3 = 100000000.0;
LAB_0010422f:
  std::ifstream::close();
  removeFile(c7);
  std::ifstream::~ifstream(local_5040);
  return dVar3;
}

Assistant:

double getCost0(int i) {
    //remove("/home/ws/zzZyj/data/temp1.pdb"); remove("default.sc");
    /*system("/home/ws/GL/rosetta_source/bin/score.linuxgccrelease -database \
                   /home/ws/GL/rosetta_database/ \
                   -s /home/ws/zzZyj/data/energyFile/tempFile/temp_1.pdb \
                   -out:file:scorefile /home/ws/zzZyj/data/default0.sc");*/
    const char *temp_File = catStrIntStr(energyFileAddress, "tempFile/temp_", i, ".pdb");
    const char *defaultFile = catStrIntStr(energyFileAddress, "/defaultFile/default", i, ".sc");
    /*const char *command = catStrStr("/home/ws/GL/rosetta_source/bin/score.linuxgccrelease \
                                            -database /home/ws/GL/rosetta_database/ -s ",
                    temp_File, " -out:file:scorefile ", defaultFile);*/
    const char *command = catStrStr(scoreAddress, " -database ", databaseAddress," -s ",
                                    temp_File, " -out:file:scorefile ", defaultFile);
    system(command);
    ifstream infile;
    openFile(defaultFile, infile);
    char buffer[10000], strAns[10000];
    double ans=0;
    infile.getline(buffer, 10000);
    infile >> buffer >> strAns;
    int len = strlen(strAns);
    if (strAns[0]=='n' || (len>=2 && strAns[1]=='n'))
        ans = INF;
    else
        ans = atof(strAns);
    infile.close();
    removeFile(defaultFile);
    return ans;
}